

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O0

void __thiscall
IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,ArithmeticalExpression *expression)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *__lhs;
  ExpressionWrapper *pEVar4;
  ConstExpression *this_00;
  SubtreeWrapper *pSVar5;
  ExpressionWrapper *this_01;
  BinopExpression *pBVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SubtreeWrapper *pSVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  SubtreeWrapper *rhs_1;
  SubtreeWrapper *lhs_1;
  SubtreeWrapper *rhs;
  ExpressionWrapper *lhs;
  string *op;
  ArithmeticalExpression *expression_local;
  IRTreeBuildVisitor *this_local;
  
  __lhs = &expression->operation_;
  if (expression->lhs_ == (Expression *)0x0) {
    pEVar4 = (ExpressionWrapper *)operator_new(0x10);
    this_00 = (ConstExpression *)operator_new(0x10);
    IRT::ConstExpression::ConstExpression(this_00,0);
    IRT::ExpressionWrapper::ExpressionWrapper(pEVar4,(Expression *)this_00);
    pSVar5 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &expression->rhs_->super_Node);
    this_01 = (ExpressionWrapper *)operator_new(0x10);
    pBVar6 = (BinopExpression *)operator_new(0x20);
    iVar2 = (*(pEVar4->super_SubtreeWrapper)._vptr_SubtreeWrapper[2])();
    iVar3 = (*pSVar5->_vptr_SubtreeWrapper[2])();
    IRT::BinopExpression::BinopExpression
              (pBVar6,MINUS,(Expression *)CONCAT44(extraout_var,iVar2),
               (Expression *)CONCAT44(extraout_var_00,iVar3));
    IRT::ExpressionWrapper::ExpressionWrapper(this_01,(Expression *)pBVar6);
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_01;
  }
  else {
    pSVar5 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &expression->lhs_->super_Node);
    pSVar7 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &expression->rhs_->super_Node);
    bVar1 = std::operator==(__lhs,"+");
    if (bVar1) {
      pEVar4 = (ExpressionWrapper *)operator_new(0x10);
      pBVar6 = (BinopExpression *)operator_new(0x20);
      iVar2 = (*pSVar5->_vptr_SubtreeWrapper[2])();
      iVar3 = (*pSVar7->_vptr_SubtreeWrapper[2])();
      IRT::BinopExpression::BinopExpression
                (pBVar6,PLUS,(Expression *)CONCAT44(extraout_var_01,iVar2),
                 (Expression *)CONCAT44(extraout_var_02,iVar3));
      IRT::ExpressionWrapper::ExpressionWrapper(pEVar4,(Expression *)pBVar6);
      (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pEVar4;
    }
    else {
      bVar1 = std::operator==(__lhs,"-");
      if (bVar1) {
        pEVar4 = (ExpressionWrapper *)operator_new(0x10);
        pBVar6 = (BinopExpression *)operator_new(0x20);
        iVar2 = (*pSVar5->_vptr_SubtreeWrapper[2])();
        iVar3 = (*pSVar7->_vptr_SubtreeWrapper[2])();
        IRT::BinopExpression::BinopExpression
                  (pBVar6,MINUS,(Expression *)CONCAT44(extraout_var_03,iVar2),
                   (Expression *)CONCAT44(extraout_var_04,iVar3));
        IRT::ExpressionWrapper::ExpressionWrapper(pEVar4,(Expression *)pBVar6);
        (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pEVar4;
      }
      else {
        bVar1 = std::operator==(__lhs,"*");
        if (bVar1) {
          pEVar4 = (ExpressionWrapper *)operator_new(0x10);
          pBVar6 = (BinopExpression *)operator_new(0x20);
          iVar2 = (*pSVar5->_vptr_SubtreeWrapper[2])();
          iVar3 = (*pSVar7->_vptr_SubtreeWrapper[2])();
          IRT::BinopExpression::BinopExpression
                    (pBVar6,MUL,(Expression *)CONCAT44(extraout_var_05,iVar2),
                     (Expression *)CONCAT44(extraout_var_06,iVar3));
          IRT::ExpressionWrapper::ExpressionWrapper(pEVar4,(Expression *)pBVar6);
          (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pEVar4
          ;
        }
        else {
          bVar1 = std::operator==(__lhs,"/");
          if (bVar1) {
            pEVar4 = (ExpressionWrapper *)operator_new(0x10);
            pBVar6 = (BinopExpression *)operator_new(0x20);
            iVar2 = (*pSVar5->_vptr_SubtreeWrapper[2])();
            iVar3 = (*pSVar7->_vptr_SubtreeWrapper[2])();
            IRT::BinopExpression::BinopExpression
                      (pBVar6,DIV,(Expression *)CONCAT44(extraout_var_07,iVar2),
                       (Expression *)CONCAT44(extraout_var_08,iVar3));
            IRT::ExpressionWrapper::ExpressionWrapper(pEVar4,(Expression *)pBVar6);
            (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ =
                 (SubtreeWrapper *)pEVar4;
          }
          else {
            bVar1 = std::operator==(__lhs,"%");
            if (bVar1) {
              pEVar4 = (ExpressionWrapper *)operator_new(0x10);
              pBVar6 = (BinopExpression *)operator_new(0x20);
              iVar2 = (*pSVar5->_vptr_SubtreeWrapper[2])();
              iVar3 = (*pSVar7->_vptr_SubtreeWrapper[2])();
              IRT::BinopExpression::BinopExpression
                        (pBVar6,MOD,(Expression *)CONCAT44(extraout_var_09,iVar2),
                         (Expression *)CONCAT44(extraout_var_10,iVar3));
              IRT::ExpressionWrapper::ExpressionWrapper(pEVar4,(Expression *)pBVar6);
              (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ =
                   (SubtreeWrapper *)pEVar4;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(ArithmeticalExpression* expression) {
  const std::string& op = expression->operation_;

  if (expression->lhs_ == nullptr) {
    auto lhs = new IRT::ExpressionWrapper(new IRT::ConstExpression(0));
    auto rhs = Accept(expression->rhs_);

    tos_value_ = new IRT::ExpressionWrapper(
        new IRT::BinopExpression(IRT::BinaryOperatorType::MINUS,
                                 lhs->ToExpression(), rhs->ToExpression()));
  } else {
    auto lhs = Accept(expression->lhs_);
    auto rhs = Accept(expression->rhs_);

    if (op == "+") {
      tos_value_ = new IRT::ExpressionWrapper(
          new IRT::BinopExpression(IRT::BinaryOperatorType::PLUS,
                                   lhs->ToExpression(), rhs->ToExpression()));
    } else if (op == "-") {
      tos_value_ = new IRT::ExpressionWrapper(
          new IRT::BinopExpression(IRT::BinaryOperatorType::MINUS,
                                   lhs->ToExpression(), rhs->ToExpression()));
    } else if (op == "*") {
      tos_value_ = new IRT::ExpressionWrapper(
          new IRT::BinopExpression(IRT::BinaryOperatorType::MUL,
                                   lhs->ToExpression(), rhs->ToExpression()));
    } else if (op == "/") {
      tos_value_ = new IRT::ExpressionWrapper(
          new IRT::BinopExpression(IRT::BinaryOperatorType::DIV,
                                   lhs->ToExpression(), rhs->ToExpression()));
    } else if (op == "%") {
      tos_value_ = new IRT::ExpressionWrapper(
          new IRT::BinopExpression(IRT::BinaryOperatorType::MOD,
                                   lhs->ToExpression(), rhs->ToExpression()));
    }
  }
}